

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PushFunctionBlockerBarrier(cmMakefile *this)

{
  unsigned_long local_8;
  
  local_8 = (long)(this->FunctionBlockers).
                  super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->FunctionBlockers).
                  super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->FunctionBlockerBarriers,&local_8);
  return;
}

Assistant:

void cmMakefile::PushFunctionBlockerBarrier()
{
  this->FunctionBlockerBarriers.push_back(this->FunctionBlockers.size());
}